

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall BasicBlock::InvertBranch(BasicBlock *this,BranchInstr *branch)

{
  BasicBlock *pBVar1;
  Type pSVar2;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar3;
  code *pcVar4;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar5;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar6;
  bool bVar7;
  undefined4 *puVar8;
  long lVar9;
  Func **ppFVar10;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar11;
  
  pBVar1 = this->next;
  ppFVar10 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar10 = &this->func;
  }
  lVar9 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar9 = 0xd0;
  }
  if (*(BranchInstr **)((long)&(*ppFVar10)->m_alloc + lVar9) != branch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49c,"(this->GetLastInstr() == branch)","this->GetLastInstr() == branch");
    if (!bVar7) goto LAB_004159ab;
    *puVar8 = 0;
  }
  pSVar2 = (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  pSVar11 = &this->succList;
  if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2 == pSVar11) ||
     ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2->next->next != pSVar11)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49d,"(this->GetSuccList()->HasTwo())","this->GetSuccList()->HasTwo()");
    if (!bVar7) {
LAB_004159ab:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  IR::BranchInstr::Invert(branch);
  pSVar5 = pSVar11;
  pSVar6 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
           (pSVar11->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  while (pSVar6 != pSVar11) {
    pSVar3 = (SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
             (pSVar6->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar6->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar5;
    pSVar5 = pSVar6;
    pSVar6 = pSVar3;
  }
  (pSVar6->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar5;
  return;
}

Assistant:

void
BasicBlock::InvertBranch(IR::BranchInstr *branch)
{
    Assert(this->GetLastInstr() == branch);
    Assert(this->GetSuccList()->HasTwo());

    branch->Invert();
    this->GetSuccList()->Reverse();
}